

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

bool __thiscall
HeadersSyncState::ValidateAndProcessSingleHeader(HeadersSyncState *this,CBlockHeader *current)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Level level;
  size_t sVar3;
  size_type sVar4;
  long lVar5;
  ulong uVar6;
  Params *params;
  bitdeque<32768> *this_00;
  CBlockHeader *pCVar7;
  int source_line;
  char *flag;
  ulong height;
  long in_FS_OFFSET;
  byte bVar8;
  string_view logging_function;
  string_view source_file;
  long *in_stack_ffffffffffffff08;
  undefined4 uStack_f0;
  int next_height;
  CBlockIndex local_e8;
  base_uint<256U> local_50;
  long local_30;
  
  bVar8 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == PRESYNC) {
    next_height = (int)this->m_current_height + 1;
    params = this->m_consensus_params;
    height = (ulong)next_height;
    uVar6 = height;
    bVar2 = PermittedDifficultyTransition
                      (params,height,(this->m_last_header_received).nBits,current->nBits);
    if (bVar2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = height;
      if (SUB164(auVar1 % ZEXT816(0x267),0) == this->m_commit_offset) {
        this_00 = &this->m_header_commitments;
        CBlockHeader::GetHash((uint256 *)&local_e8,current);
        sVar3 = SaltedTxidHasher::operator()(&this->m_hasher,(uint256 *)&local_e8);
        level = (Level)sVar3 & Debug;
        bitdeque<32768>::push_back(this_00,SUB41(level,0));
        sVar4 = bitdeque<32768>::size(this_00);
        if (this->m_max_commitments < sVar4) {
          bVar2 = ::LogAcceptCategory((LogFlags)this_00,level);
          if (bVar2) {
            flag = 
            "Initial headers sync aborted with peer=%d: exceeded max commitments at height=%i (presync phase)\n"
            ;
            source_line = 0xcc;
            goto LAB_003bf93c;
          }
          goto LAB_003bf81a;
        }
      }
      CBlockIndex::CBlockIndex(&local_e8,current);
      GetBlockProof((arith_uint256 *)&local_50,&local_e8);
      base_uint<256U>::operator+=(&(this->m_current_chain_work).super_base_uint<256U>,&local_50);
      pCVar7 = &this->m_last_header_received;
      for (lVar5 = 0x14; lVar5 != 0; lVar5 = lVar5 + -1) {
        pCVar7->nVersion = current->nVersion;
        current = (CBlockHeader *)((long)current + (ulong)bVar8 * -8 + 4);
        pCVar7 = (CBlockHeader *)((long)pCVar7 + (ulong)bVar8 * -8 + 4);
      }
      this->m_current_height = (long)next_height;
      bVar2 = true;
      goto LAB_003bf81c;
    }
    bVar2 = ::LogAcceptCategory((LogFlags)params,(Level)uVar6);
    if (bVar2) {
      flag = 
      "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (presync phase)\n"
      ;
      source_line = 0xc0;
LAB_003bf93c:
      logging_function._M_str = "ValidateAndProcessSingleHeader";
      logging_function._M_len = 0x1e;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x58;
      LogPrintf_<long,int>
                (logging_function,source_file,source_line,(LogFlags)flag,(int)this + 8,
                 (char *)&next_height,in_stack_ffffffffffffff08,
                 (int *)CONCAT44(next_height,uStack_f0));
    }
  }
LAB_003bf81a:
  bVar2 = false;
LAB_003bf81c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndProcessSingleHeader(const CBlockHeader& current)
{
    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    int next_height = m_current_height + 1;

    // Verify that the difficulty isn't growing too fast; an adversary with
    // limited hashing capability has a greater chance of producing a high
    // work chain if they compress the work into as few blocks as possible,
    // so don't let anyone give a chain that would violate the difficulty
    // adjustment maximum.
    if (!PermittedDifficultyTransition(m_consensus_params, next_height,
                m_last_header_received.nBits, current.nBits)) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (presync phase)\n", m_id, next_height);
        return false;
    }

    if (next_height % HEADER_COMMITMENT_PERIOD == m_commit_offset) {
        // Add a commitment.
        m_header_commitments.push_back(m_hasher(current.GetHash()) & 1);
        if (m_header_commitments.size() > m_max_commitments) {
            // The peer's chain is too long; give up.
            // It's possible the chain grew since we started the sync; so
            // potentially we could succeed in syncing the peer's chain if we
            // try again later.
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: exceeded max commitments at height=%i (presync phase)\n", m_id, next_height);
            return false;
        }
    }

    m_current_chain_work += GetBlockProof(CBlockIndex(current));
    m_last_header_received = current;
    m_current_height = next_height;

    return true;
}